

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O2

void __thiscall ObjectFileDB::process_labels(ObjectFileDB *this)

{
  pointer pbVar1;
  pointer pOVar2;
  uint32_t uVar3;
  mapped_type *pmVar4;
  uint uVar5;
  ObjectFileData *obj;
  pointer pOVar6;
  iterator __begin2;
  pointer __k;
  Timer process_label_timer;
  
  puts("- Processing Labels...");
  Timer::Timer(&process_label_timer);
  pbVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obj_files_by_name)._M_h._M_element_count == (long)pbVar1 - (long)__k >> 5) {
    uVar5 = 0;
    for (; __k != pbVar1; __k = __k + 1) {
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,__k);
      pOVar2 = (pmVar4->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar6 = (pmVar4->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>).
                    _M_impl.super__Vector_impl_data._M_start; pOVar6 != pOVar2; pOVar6 = pOVar6 + 1)
      {
        uVar3 = LinkedObjectFile::set_ordered_label_names(&pOVar6->linked_data);
        uVar5 = uVar5 + uVar3;
      }
    }
    puts("Processed Labels:");
    printf(" total %d labels\n",(ulong)uVar5);
    Timer::getMs(&process_label_timer);
    printf(" total %.3f ms\n");
    putchar(10);
    return;
  }
  __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                ,0x3e,
                "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:257:16)]"
               );
}

Assistant:

void ObjectFileDB::process_labels() {
  printf("- Processing Labels...\n");
  Timer process_label_timer;
  uint32_t total = 0;
  for_each_obj([&](ObjectFileData& obj) { total += obj.linked_data.set_ordered_label_names(); });

  printf("Processed Labels:\n");
  printf(" total %d labels\n", total);
  printf(" total %.3f ms\n", process_label_timer.getMs());
  printf("\n");
}